

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O2

void __thiscall proto2_unittest::TestPackedEnumSmallRange::Clear(TestPackedEnumSmallRange *this)

{
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.vals_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestPackedEnumSmallRange::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestPackedEnumSmallRange)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.vals_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}